

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O1

U32 ZSTD_litLengthPrice(U32 litLength,optState_t *optPtr)

{
  short sVar1;
  U32 UVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  
  if (optPtr->priceType == zop_predef) {
    UVar2 = 0x1f;
    if (litLength + 1 != 0) {
      for (; litLength + 1 >> UVar2 == 0; UVar2 = UVar2 - 1) {
      }
    }
    return UVar2;
  }
  if (optPtr->priceType == zop_static) {
    if (litLength < 0x40) {
      uVar4 = (uint)(byte)ZSTD_LLcode_LL_Code[litLength];
    }
    else {
      uVar4 = 0x1f;
      if (litLength != 0) {
        for (; litLength >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      uVar4 = (uVar4 ^ 0xffffffe0) + 0x33;
    }
    sVar1 = (short)optPtr->symbolCosts->litlengthCTable[0];
    lVar6 = 1;
    if (sVar1 != 0) {
      lVar6 = (long)(1 << ((char)sVar1 - 1U & 0x1f));
    }
    return (optPtr->symbolCosts->litlengthCTable[lVar6 + (ulong)uVar4 * 2 + 2] + 0xffff >> 0x10) +
           LL_bits[uVar4];
  }
  if (litLength < 0x40) {
    uVar4 = (uint)(byte)ZSTD_LLcode_LL_Code[litLength];
  }
  else {
    uVar4 = 0x1f;
    if (litLength != 0) {
      for (; litLength >> uVar4 == 0; uVar4 = uVar4 - 1) {
      }
    }
    uVar4 = (uVar4 ^ 0xffffffe0) + 0x33;
  }
  uVar5 = optPtr->litLengthFreq[uVar4] + 1;
  uVar3 = 0x1f;
  if (uVar5 != 0) {
    for (; uVar5 >> uVar3 == 0; uVar3 = uVar3 - 1) {
    }
  }
  return ((uVar3 ^ 0x1f) + optPtr->log2litLengthSum + LL_bits[uVar4]) - 0x1f;
}

Assistant:

static U32 ZSTD_litLengthPrice(U32 const litLength, const optState_t* const optPtr)
{
    if (optPtr->priceType == zop_static) {
        U32 const llCode = ZSTD_LLcode(litLength);
        FSE_CState_t cstate;
        FSE_initCState(&cstate, optPtr->symbolCosts->litlengthCTable);
        {   U32 const price = LL_bits[llCode]*BITCOST_MULTIPLIER + BITCOST_SYMBOL(cstate.symbolTT, cstate.stateLog, llCode);
            DEBUGLOG(8, "ZSTD_litLengthPrice: ll=%u, bitCost=%.2f", litLength, (double)price / BITCOST_MULTIPLIER);
            return price;
    }   }
    if (optPtr->priceType == zop_predef) return ZSTD_highbit32((U32)litLength+1);

    /* dynamic statistics */
    {   U32 const llCode = ZSTD_LLcode(litLength);
        return (LL_bits[llCode] + optPtr->log2litLengthSum - ZSTD_highbit32(optPtr->litLengthFreq[llCode]+1)) * BITCOST_MULTIPLIER;
    }
}